

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
SharedPtrTests_advanced_Move_Test::SharedPtrTests_advanced_Move_Test
          (SharedPtrTests_advanced_Move_Test *this)

{
  SharedPtrTests_advanced_Move_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SharedPtrTests_advanced_Move_Test_0016eb90;
  return;
}

Assistant:

TEST(SharedPtrTests_advanced, Move) {
	int* a;
	a = new int;
	*a = 1234;
	SharedPtr<int> t1(a);
	SharedPtr<int> t2(std::move(t1));
	EXPECT_EQ(t2.use_count(), 1);
	EXPECT_EQ(t1.get(), nullptr);
	EXPECT_EQ(t2.get(), a);
}